

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htable.c
# Opt level: O2

HTABLE_NODE *
htable_remove(HTABLE *htable,HTABLE_NODE *key,HTABLE_CMP_FUNC cmp_func,HTABLE_HASH_FUNC hash_func)

{
  int iVar1;
  void *pvVar2;
  void *__ptr;
  long lVar3;
  uint32_t hash;
  HTABLE_NODE *pHVar4;
  ulong uVar5;
  ulong uVar6;
  long *plVar7;
  long *plVar8;
  HTABLE_NODE **p_ref;
  
  hash = (*hash_func)(key);
  pHVar4 = htable_lookup_internal(htable,hash,key,&p_ref,cmp_func);
  if (pHVar4 != (HTABLE_NODE *)0x0) {
    *p_ref = pHVar4->next;
    uVar6 = htable->n - 1;
    htable->n = uVar6;
    iVar1 = htable->n_planes;
    if (uVar6 < (ulong)(long)(((0x3b << ((byte)iVar1 & 0x1f)) + -0x3b) / 4)) {
      if (uVar6 == 0) {
        htable_free_all_planes(htable);
      }
      else if (1 < iVar1) {
        pvVar2 = htable->planes[iVar1 - 2U];
        __ptr = htable->planes[iVar1 - 1U];
        for (uVar6 = 0; uVar6 != (long)(0x3b << ((byte)(iVar1 - 1U) & 0x1f)); uVar6 = uVar6 + 1) {
          plVar8 = *(long **)((long)__ptr + uVar6 * 8);
          if (plVar8 != (long *)0x0) {
            uVar5 = uVar6 % (ulong)(long)(0x3b << ((byte)(iVar1 - 2U) & 0x1f));
            lVar3 = *(long *)((long)pvVar2 + uVar5 * 8);
            if (lVar3 != 0) {
              do {
                plVar7 = plVar8;
                plVar8 = (long *)*plVar7;
              } while (plVar8 != (long *)0x0);
              *plVar7 = lVar3;
              plVar8 = *(long **)((long)__ptr + uVar6 * 8);
            }
            *(long **)((long)pvVar2 + uVar5 * 8) = plVar8;
          }
        }
        free(__ptr);
        htable->n_planes = htable->n_planes + -1;
      }
    }
  }
  return pHVar4;
}

Assistant:

HTABLE_NODE*
htable_remove(HTABLE* htable, const HTABLE_NODE* key,
              HTABLE_CMP_FUNC cmp_func, HTABLE_HASH_FUNC hash_func)
{
    uint32_t hash;
    HTABLE_NODE* node;
    HTABLE_NODE** p_ref;

    hash = hash_func(key);
    node = htable_lookup_internal(htable, hash, key, &p_ref, cmp_func);
    if(node == NULL)
        return NULL;

    *p_ref = node->next;
    htable->n--;

    if(HTABLE_TOO_EMPTY(htable))
        htable_shrink(htable);

    return node;
}